

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O3

ref<immutable::rrb_details::internal_node<int,_true>_> __thiscall
immutable::rrb_details::rebalance<int,true,5>
          (rrb_details *this,ref<immutable::rrb_details::internal_node<int,_true>_> *left,
          ref<immutable::rrb_details::internal_node<int,_true>_> *centre,
          ref<immutable::rrb_details::internal_node<int,_true>_> *right,uint32_t shift,bool is_top)

{
  long lVar1;
  ref<immutable::rrb_details::internal_node<int,_true>_> rVar2;
  ref<immutable::rrb_details::internal_node<int,_true>_> rVar3;
  uint32_t shift_00;
  internal_node<int,_true> *piVar4;
  undefined8 *puVar5;
  uint uVar6;
  long lVar8;
  ulong uVar9;
  ref<immutable::rrb_details::internal_node<int,_true>_> new_left;
  uint32_t top_len;
  ref<immutable::rrb_details::internal_node<int,_true>_> new_all;
  ref<immutable::rrb_details::internal_node<int,_true>_> all;
  ref<immutable::rrb_details::internal_node<int,_true>_> new_right;
  vector<unsigned_int,_std::allocator<unsigned_int>_> node_count;
  ref<immutable::rrb_details::internal_node<int,_true>_> local_90;
  undefined1 local_84 [4];
  ref<immutable::rrb_details::internal_node<int,_true>_> local_80;
  ref<immutable::rrb_details::internal_node<int,_true>_> local_78;
  ref<immutable::rrb_details::internal_node<int,_true>_> local_70;
  ref<immutable::rrb_details::internal_node<int,_true>_> local_68;
  ref<immutable::rrb_details::internal_node<int,_true>_> local_60;
  uint32_t local_54;
  internal_node<int,_true> *local_50;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  ulong uVar7;
  
  local_78.ptr = internal_node_merge<int,true>(left,centre,right);
  if (local_78.ptr != (internal_node<int,_true> *)0x0) {
    LOCK();
    uVar6 = ((local_78.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i;
    ((local_78.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i = 1;
    right = (ref<immutable::rrb_details::internal_node<int,_true>_> *)(ulong)uVar6;
    UNLOCK();
  }
  create_concat_plan<int,true,5>
            (&local_48,(rrb_details *)&local_78,
             (ref<immutable::rrb_details::internal_node<int,_true>_> *)local_84,(uint32_t *)right);
  execute_concat_plan<int,true,5>
            ((rrb_details *)&local_80,&local_78,&local_48,(uint32_t)local_84,shift);
  rVar2.ptr = local_80.ptr;
  if ((uint)local_84 < 0x21) {
    if (is_top) {
      *(internal_node<int,_true> **)this = local_80.ptr;
      if (local_80.ptr != (internal_node<int,_true> *)0x0) {
        LOCK();
        ((local_80.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i =
             ((local_80.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i + 1;
        UNLOCK();
      }
    }
    else {
      set_sizes<int,true,5>((rrb_details *)&local_90,&local_80,shift);
      puVar5 = (undefined8 *)malloc(0x28);
      *puVar5 = 0x100000001;
      puVar5[2] = 0;
      *(undefined4 *)((long)puVar5 + 0xc) = 0;
      puVar5[3] = (ref<immutable::rrb_details::internal_node<int,_true>_> *)(puVar5 + 4);
      puVar5[4] = 0;
      ref<immutable::rrb_details::internal_node<int,_true>_>::operator=
                ((ref<immutable::rrb_details::internal_node<int,_true>_> *)(puVar5 + 4),&local_90);
      *(undefined8 **)this = puVar5;
      LOCK();
      *(undefined4 *)(puVar5 + 1) = 1;
      UNLOCK();
      release<int>(local_90.ptr);
    }
  }
  else {
    local_54 = shift;
    piVar4 = (internal_node<int,_true> *)malloc(0x120);
    piVar4->type = INTERNAL_NODE;
    piVar4->len = 0x20;
    (piVar4->size_table).ptr = (rrb_size_table<true> *)0x0;
    piVar4->guid = 0;
    piVar4->child = (ref<immutable::rrb_details::internal_node<int,_true>_> *)(piVar4 + 1);
    lVar8 = 0;
    memset(piVar4 + 1,0,0x100);
    do {
      ref<immutable::rrb_details::internal_node<int,_true>_>::operator=
                ((ref<immutable::rrb_details::internal_node<int,_true>_> *)
                 ((long)&piVar4->child->ptr + lVar8),
                 (ref<immutable::rrb_details::internal_node<int,_true>_> *)
                 ((long)&(rVar2.ptr)->child->ptr + lVar8));
      rVar3.ptr = local_80.ptr;
      lVar8 = lVar8 + 8;
    } while (lVar8 != 0x100);
    LOCK();
    (piVar4->_ref_count).super___atomic_base<unsigned_int>._M_i = 1;
    UNLOCK();
    uVar6 = (int)local_84 - 0x20;
    uVar7 = (ulong)uVar6;
    local_90.ptr = piVar4;
    local_50 = (internal_node<int,_true> *)this;
    piVar4 = (internal_node<int,_true> *)malloc(uVar7 * 8 + 0x20);
    piVar4->len = uVar6;
    piVar4->type = INTERNAL_NODE;
    (piVar4->size_table).ptr = (rrb_size_table<true> *)0x0;
    piVar4->guid = 0;
    piVar4->child = (ref<immutable::rrb_details::internal_node<int,_true>_> *)(piVar4 + 1);
    memset(piVar4 + 1,0,uVar7 * 8);
    if (uVar6 != 0) {
      uVar9 = 0x20;
      lVar8 = 0;
      do {
        ref<immutable::rrb_details::internal_node<int,_true>_>::operator=
                  ((ref<immutable::rrb_details::internal_node<int,_true>_> *)
                   ((long)&piVar4->child->ptr + lVar8),(rVar3.ptr)->child + (uVar9 & 0xffffffff));
        lVar1 = uVar9 - uVar7;
        uVar9 = uVar9 + 1;
        lVar8 = lVar8 + 8;
      } while (lVar1 != 0x1f);
    }
    shift_00 = local_54;
    LOCK();
    (piVar4->_ref_count).super___atomic_base<unsigned_int>._M_i = 1;
    UNLOCK();
    local_60.ptr = piVar4;
    set_sizes<int,true,5>((rrb_details *)&local_68,&local_90,local_54);
    set_sizes<int,true,5>((rrb_details *)&local_70,&local_60,shift_00);
    this = (rrb_details *)local_50;
    puVar5 = (undefined8 *)malloc(0x30);
    *puVar5 = 0x200000001;
    puVar5[2] = 0;
    *(undefined4 *)((long)puVar5 + 0xc) = 0;
    puVar5[3] = (ref<immutable::rrb_details::internal_node<int,_true>_> *)(puVar5 + 4);
    puVar5[4] = 0;
    puVar5[5] = 0;
    ref<immutable::rrb_details::internal_node<int,_true>_>::operator=
              ((ref<immutable::rrb_details::internal_node<int,_true>_> *)(puVar5 + 4),&local_68);
    ref<immutable::rrb_details::internal_node<int,_true>_>::operator=
              ((ref<immutable::rrb_details::internal_node<int,_true>_> *)(puVar5[3] + 8),&local_70);
    *(undefined8 **)this = puVar5;
    LOCK();
    *(undefined4 *)(puVar5 + 1) = 1;
    UNLOCK();
    release<int>(local_70.ptr);
    release<int>(local_68.ptr);
    release<int>(local_60.ptr);
    release<int>(local_90.ptr);
  }
  release<int>(local_80.ptr);
  if (local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  release<int>(local_78.ptr);
  return (ref<immutable::rrb_details::internal_node<int,_true>_>)(internal_node<int,_true> *)this;
}

Assistant:

inline ref<internal_node<T, atomic_ref_counting>> rebalance(const ref<internal_node<T, atomic_ref_counting>>& left, const ref<internal_node<T, atomic_ref_counting>>& centre, const ref<internal_node<T, atomic_ref_counting>>& right, uint32_t shift, bool is_top)
      {
      ref<internal_node<T, atomic_ref_counting>> all = internal_node_merge(left, centre, right);
      // top_len is children count of the internal node returned.
      uint32_t top_len; // populated through pointer manipulation.

      std::vector<uint32_t> node_count = create_concat_plan<T, atomic_ref_counting, N>(all, &top_len);

      ref<internal_node<T, atomic_ref_counting>> new_all = execute_concat_plan<T, atomic_ref_counting, N>(all, node_count, top_len, shift);
      if (top_len <= bits<N>::rrb_branching)
        {
        if (is_top == false)
          {
          return internal_node_new_above1(set_sizes<T, atomic_ref_counting, N>(new_all, shift));
          }
        else
          {
          return new_all;
          }
        }
      else
        {
        ref<internal_node<T, atomic_ref_counting>> new_left = internal_node_copy(new_all.ptr, 0, bits<N>::rrb_branching);
        ref<internal_node<T, atomic_ref_counting>> new_right = internal_node_copy(new_all.ptr, bits<N>::rrb_branching, top_len - bits<N>::rrb_branching);
        return internal_node_new_above<T, atomic_ref_counting>(set_sizes<T, atomic_ref_counting, N>(new_left, shift), set_sizes<T, atomic_ref_counting, N>(new_right, shift));
        }
      }